

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hist.c
# Opt level: O0

uint HIST_count_simple(uint *count,uint *maxSymbolValuePtr,void *src,size_t srcSize)

{
  uint local_4c;
  uint local_48;
  U32 s;
  uint largestCount;
  uint maxSymbolValue;
  BYTE *end;
  BYTE *ip;
  size_t srcSize_local;
  void *src_local;
  uint *maxSymbolValuePtr_local;
  uint *count_local;
  
  s = *maxSymbolValuePtr;
  local_48 = 0;
  memset(count,0,(ulong)(s + 1) << 2);
  end = (BYTE *)src;
  if (srcSize == 0) {
    *maxSymbolValuePtr = 0;
    count_local._4_4_ = 0;
  }
  else {
    while (end < (BYTE *)((long)src + srcSize)) {
      count[*end] = count[*end] + 1;
      end = end + 1;
    }
    for (; count[s] == 0; s = s - 1) {
    }
    *maxSymbolValuePtr = s;
    for (local_4c = 0; local_4c <= s; local_4c = local_4c + 1) {
      if (local_48 < count[local_4c]) {
        local_48 = count[local_4c];
      }
    }
    count_local._4_4_ = local_48;
  }
  return count_local._4_4_;
}

Assistant:

unsigned HIST_count_simple(unsigned* count, unsigned* maxSymbolValuePtr,
                           const void* src, size_t srcSize)
{
    const BYTE* ip = (const BYTE*)src;
    const BYTE* const end = ip + srcSize;
    unsigned maxSymbolValue = *maxSymbolValuePtr;
    unsigned largestCount=0;

    ZSTD_memset(count, 0, (maxSymbolValue+1) * sizeof(*count));
    if (srcSize==0) { *maxSymbolValuePtr = 0; return 0; }

    while (ip<end) {
        assert(*ip <= maxSymbolValue);
        count[*ip++]++;
    }

    while (!count[maxSymbolValue]) maxSymbolValue--;
    *maxSymbolValuePtr = maxSymbolValue;

    {   U32 s;
        for (s=0; s<=maxSymbolValue; s++)
            if (count[s] > largestCount) largestCount = count[s];
    }

    return largestCount;
}